

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateParsingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldDescriptor *in_RSI;
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  
  bVar1 = CheckUtf8(in_RSI);
  if (bVar1) {
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  }
  else {
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  }
  return;
}

Assistant:

void ImmutableStringFieldGenerator::GenerateParsingCode(
    io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
                   "java.lang.String s = input.readStringRequireUtf8();\n"
                   "$set_has_field_bit_message$\n"
                   "$name$_ = s;\n");
  } else {
    printer->Print(variables_,
                   "com.google.protobuf.ByteString bs = input.readBytes();\n"
                   "$set_has_field_bit_message$\n"
                   "$name$_ = bs;\n");
  }
}